

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server_sync.cpp
# Opt level: O0

void Session(socket *socket)

{
  error_code ec_00;
  bool bVar1;
  ostream *this;
  system_error *this_00;
  exception *e;
  size_t local_468;
  undefined1 auStack_460 [40];
  mutable_buffer local_438;
  size_t local_428;
  size_t length;
  error_code ec;
  array<char,_1024UL> data;
  socket *socket_local;
  
  while( true ) {
    boost::system::error_code::error_code((error_code *)&length);
    local_438 = boost::asio::buffer<char,1024ul>((array<char,_1024UL> *)&ec.cat_);
    local_428 = boost::asio::
                basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                ::read_some<boost::asio::mutable_buffer>(socket,&local_438,(error_code *)&length);
    boost::system::error_code::error_code<boost::asio::error::misc_errors>
              ((error_code *)(auStack_460 + 8),eof,(type *)0x0);
    bVar1 = boost::system::operator==((error_code *)&length,(error_code *)(auStack_460 + 8));
    if (bVar1) {
      this = std::operator<<((ostream *)&std::cout,"Connection closed cleanly by peer.");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      return;
    }
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&length);
    if (bVar1) break;
    _e = boost::asio::buffer<char,1024ul>((array<char,_1024UL> *)&ec.cat_,local_428);
    boost::asio::
    write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffer>
              (socket,(mutable_buffer *)&e,(type *)0x0);
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  local_468 = length;
  auStack_460._0_4_ = ec.val_;
  auStack_460[4] = ec.failed_;
  auStack_460._5_3_ = ec._5_3_;
  ec_00.cat_ = (error_category *)ec._0_8_;
  ec_00.val_ = (undefined4)length;
  ec_00.failed_ = (bool)length._4_1_;
  ec_00._5_3_ = length._5_3_;
  boost::system::system_error::system_error(this_00,ec_00);
  __cxa_throw(this_00,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void Session(tcp::socket socket) {
  try {
    while (true) {
      std::array<char, BUF_SIZE> data;

      boost::system::error_code ec;
      std::size_t length = socket.read_some(boost::asio::buffer(data), ec);

      if (ec == boost::asio::error::eof) {
        std::cout << "Connection closed cleanly by peer." << std::endl;
        break;
      } else if (ec) {
        // Some other error
        throw boost::system::system_error(ec);
      }

      boost::asio::write(socket, boost::asio::buffer(data, length));
    }
  } catch (const std::exception& e) {
    std::cerr << "Exception: " <<  e.what() << std::endl;
  }
}